

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_1::readIntegerTextureViaFBOAndVerify
               (RenderContext *renderCtx,CallLogWrapper *glLog,deUint32 textureGL,
               TextureType textureType,TextureFormat *textureFormat,IVec3 *textureSize,
               ImageLayerVerifier *verifyLayer)

{
  TextureFormat TVar1;
  TestLog *log;
  int iVar2;
  deUint32 dVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  ObjectTraits *traits;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TestError *this;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  undefined1 local_e8 [40];
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  ScopedLogSection section;
  TextureLevel resultSlice;
  Framebuffer fbo;
  Vector<int,_4> res;
  
  log = glLog->m_log;
  TVar1 = (TextureFormat)(resultSlice.m_size.m_data + 2);
  resultSlice.m_format = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&resultSlice,"Verification","");
  local_e8._0_8_ = (long)local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,
             "Result verification (bind texture layer-by-layer to FBO, read with glReadPixels())",""
            );
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&resultSlice,(string *)local_e8);
  if (local_e8._0_8_ != (long)local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (resultSlice.m_format != TVar1) {
    operator_delete((void *)resultSlice.m_format,resultSlice._16_8_ + 1);
  }
  uVar5 = 6;
  if (textureType != TEXTURETYPE_CUBE) {
    uVar5 = textureSize->m_data[2];
  }
  GVar4 = 0xffffffff;
  if (textureType < TEXTURETYPE_LAST) {
    GVar4 = *(GLenum *)(&DAT_00984784 + (ulong)textureType * 4);
  }
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&fbo.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var,iVar2),traits);
  tcu::TextureLevel::TextureLevel
            (&resultSlice,textureFormat,textureSize->m_data[0],textureSize->m_data[1],1);
  glu::CallLogWrapper::glBindFramebuffer(glLog,0x8d40,fbo.super_ObjectWrapper.m_object);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  dVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(dVar3,"Bind FBO",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x34b);
  glu::CallLogWrapper::glMemoryBarrier(glLog,0x400);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  dVar3 = (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x800))();
  glu::checkError(dVar3,"glMemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x34e);
  glu::CallLogWrapper::glActiveTexture(glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(glLog,GVar4,textureGL);
  setTexParameteri(glLog,GVar4);
  bVar8 = (int)uVar5 < 1;
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      if (textureType == TEXTURETYPE_CUBE) {
        GVar4 = (&DAT_0098281c)
                [(int)(&(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)[uVar6]];
LAB_004414c0:
        glu::CallLogWrapper::glFramebufferTexture2D(glLog,0x8d40,0x8ce0,GVar4,textureGL,0);
      }
      else {
        if (textureType == TEXTURETYPE_2D) {
          GVar4 = 0xde1;
          goto LAB_004414c0;
        }
        if ((textureType & ~TEXTURETYPE_CUBE) == TEXTURETYPE_2D_ARRAY) {
          glu::CallLogWrapper::glFramebufferTextureLayer
                    (glLog,0x8d40,0x8ce0,textureGL,0,(GLint)uVar6);
        }
      }
      iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
      dVar3 = (**(code **)(CONCAT44(extraout_var_02,iVar2) + 0x800))();
      glu::checkError(dVar3,"Bind texture to framebuffer color attachment 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x35f);
      GVar4 = glu::CallLogWrapper::glCheckFramebufferStatus(glLog,0x8d40);
      if (GVar4 != 0x8cd5) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,(char *)0x0,
                   "glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                   ,0x361);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_e8,&resultSlice);
      if (((ulong)(uint)local_e8._4_4_ < 0x22) &&
         ((0x2c0000000U >> ((ulong)(uint)local_e8._4_4_ & 0x3f) & 1) != 0)) {
        std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
        vector(&data,(long)(int)(local_e8._12_4_ * local_e8._8_4_),(allocator_type *)&res);
        glu::CallLogWrapper::glReadPixels
                  (glLog,0,0,local_e8._8_4_,local_e8._12_4_,0x8d99,0x1405,
                   data.
                   super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        if (0 < (int)local_e8._12_4_) {
          iVar2 = 0;
          do {
            if (0 < (int)local_e8._8_4_) {
              iVar7 = 0;
              do {
                res.m_data._0_8_ =
                     *(undefined8 *)
                      data.
                      super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_e8._8_4_ * iVar2 + iVar7].
                      m_data;
                res.m_data._8_8_ =
                     *(undefined8 *)
                      (data.
                       super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_e8._8_4_ * iVar2 + iVar7].
                       m_data + 2);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_e8,(IVec4 *)&res,iVar7,iVar2,0);
                iVar7 = iVar7 + 1;
              } while (iVar7 < (int)local_e8._8_4_);
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 < (int)local_e8._12_4_);
        }
LAB_004415ee:
        if (data.
            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(data.
                          super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)data.
                                super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)data.
                                super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else if (local_e8._4_4_ - SIGNED_INT8 < 3) {
        std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
                  ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data,
                   (long)(int)(local_e8._12_4_ * local_e8._8_4_),(allocator_type *)&res);
        glu::CallLogWrapper::glReadPixels
                  (glLog,0,0,local_e8._8_4_,local_e8._12_4_,0x8d99,0x1404,
                   data.
                   super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        if (0 < (int)local_e8._12_4_) {
          iVar2 = 0;
          do {
            if (0 < (int)local_e8._8_4_) {
              iVar7 = 0;
              do {
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_e8,
                           (IVec4 *)(data.
                                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                                    (local_e8._8_4_ * iVar2 + iVar7)),iVar7,iVar2,0);
                iVar7 = iVar7 + 1;
              } while (iVar7 < (int)local_e8._8_4_);
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 < (int)local_e8._12_4_);
        }
        goto LAB_004415ee;
      }
      iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
      dVar3 = (**(code **)(CONCAT44(extraout_var_03,iVar2) + 0x800))();
      glu::checkError(dVar3,"glReadPixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x364);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_e8,&resultSlice);
      iVar2 = (**verifyLayer->_vptr_ImageLayerVerifier)
                        (verifyLayer,log,(ConstPixelBufferAccess *)local_e8,uVar6 & 0xffffffff);
      if ((char)iVar2 == '\0') break;
      uVar6 = uVar6 + 1;
      bVar8 = uVar5 <= uVar6;
    } while (uVar6 != uVar5);
  }
  tcu::TextureLevel::~TextureLevel(&resultSlice);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  tcu::TestLog::endSection(section.m_log);
  return bVar8;
}

Assistant:

static bool readIntegerTextureViaFBOAndVerify (const RenderContext&			renderCtx,
											   glu::CallLogWrapper&			glLog,
											   deUint32						textureGL,
											   TextureType					textureType,
											   const TextureFormat&			textureFormat,
											   const IVec3&					textureSize,
											   const ImageLayerVerifier&	verifyLayer)
{
	DE_ASSERT(isFormatTypeInteger(textureFormat.type));
	DE_ASSERT(textureType != TEXTURETYPE_BUFFER);

	TestLog& log = glLog.getLog();

	const tcu::ScopedLogSection section(log, "Verification", "Result verification (bind texture layer-by-layer to FBO, read with glReadPixels())");

	const int			numSlicesOrFaces	= textureType == TEXTURETYPE_CUBE ? 6 : textureSize.z();
	const deUint32		textureTargetGL		= getGLTextureTarget(textureType);
	glu::Framebuffer	fbo					(renderCtx);
	tcu::TextureLevel	resultSlice			(textureFormat, textureSize.x(), textureSize.y());

	glLog.glBindFramebuffer(GL_FRAMEBUFFER, *fbo);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Bind FBO");

	glLog.glMemoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glMemoryBarrier");

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, textureGL);
	setTexParameteri(glLog, textureTargetGL);

	for (int sliceOrFaceNdx = 0; sliceOrFaceNdx < numSlicesOrFaces; sliceOrFaceNdx++)
	{
		if (textureType == TEXTURETYPE_CUBE)
			glLog.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx)), textureGL, 0);
		else if (textureType == TEXTURETYPE_2D)
			glLog.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureGL, 0);
		else if (textureType == TEXTURETYPE_3D || textureType == TEXTURETYPE_2D_ARRAY)
			glLog.glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureGL, 0, sliceOrFaceNdx);
		else
			DE_ASSERT(false);

		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Bind texture to framebuffer color attachment 0");

		TCU_CHECK(glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

		readPixelsRGBAInteger32(resultSlice.getAccess(), 0, 0, glLog);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glReadPixels");

		if (!verifyLayer(log, resultSlice, sliceOrFaceNdx))
			return false;
	}

	return true;
}